

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PatchVertexCountCase::iterate(PatchVertexCountCase *this)

{
  TextureFormat TVar1;
  RenderContext *rCtx;
  pointer pfVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar6;
  char *description;
  int iVar7;
  iterator iVar8;
  float fVar9;
  vector<float,_std::allocator<float>_> attributeData;
  RandomViewport viewport;
  VertexArrayBinding attrBindings [1];
  undefined8 local_258;
  iterator iStack_250;
  float *local_248;
  deUint32 local_234;
  RandomViewport local_230;
  ConstPixelBufferAccess local_220;
  undefined1 local_1f8 [8];
  long *local_1f0;
  void *local_1e8;
  long local_1e0 [2];
  int local_1d0;
  TextureFormat local_1c8;
  TextureFormat local_1c0;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190;
  VertexArrayPointer local_188 [2];
  ios_base local_140 [272];
  undefined4 extraout_var_00;
  
  TVar1 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  rCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar4 = (*rCtx->_vptr_RenderContext[4])(rCtx);
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_230,(RenderTarget *)CONCAT44(extraout_var,iVar4),0x100,0x100,dVar5);
  dVar5 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar4 = (*rCtx->_vptr_RenderContext[3])(rCtx);
  lVar6 = CONCAT44(extraout_var_00,iVar4);
  (**(code **)(lVar6 + 0x1a00))(local_230.x,local_230.y,local_230.width,local_230.height);
  (**(code **)(lVar6 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar6 + 0x1680))(dVar5);
  local_1c8 = TVar1;
  local_1b8 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0,"Note: input patch size is ",0x1a);
  std::ostream::operator<<((ostringstream *)&local_1b0,this->m_inputPatchSize);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0,", output patch size is ",0x17);
  std::ostream::operator<<((ostringstream *)&local_1b0,this->m_outputPatchSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_234 = dVar5;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  std::ios_base::~ios_base(local_140);
  local_258 = (pointer)0x0;
  iStack_250._M_current = (float *)0x0;
  local_248 = (float *)0x0;
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)&local_258,(long)this->m_inputPatchSize);
  iVar4 = this->m_inputPatchSize;
  if (0 < iVar4) {
    iVar7 = 0;
    do {
      fVar9 = (float)iVar7 / (float)(iVar4 + -1);
      fVar9 = fVar9 * fVar9;
      local_1b8._0_4_ = fVar9;
      if (iStack_250._M_current == local_248) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_258,iStack_250,(float *)local_1b8
                  );
      }
      else {
        *iStack_250._M_current = fVar9;
        iStack_250._M_current = iStack_250._M_current + 1;
      }
      iVar7 = iVar7 + 1;
      iVar4 = this->m_inputPatchSize;
    } while (iVar7 < iVar4);
  }
  (**(code **)(lVar6 + 0xfd8))(0x8e72);
  (**(code **)(lVar6 + 0x188))(0x4000);
  local_220.m_format = (TextureFormat)(local_220.m_size.m_data + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"in_v_attr","");
  iVar8._M_current = iStack_250._M_current;
  pfVar2 = local_258;
  local_1f8._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_220.m_format,
             local_220.m_size.m_data._0_8_ + (long)local_220.m_format);
  local_1d0 = 0;
  local_1b8._0_4_ = local_1f8._0_4_;
  local_1b0._M_p = (pointer)&local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_1f0,(long)local_1e8 + (long)local_1f0);
  local_190 = local_1d0;
  local_188[0].componentType = VTX_COMP_FLOAT;
  local_188[0].convert = VTX_COMP_CONVERT_NONE;
  local_188[0].numComponents = 1;
  local_188[0].numElements = (int)((ulong)((long)iVar8._M_current - (long)pfVar2) >> 2);
  local_188[0].stride = 0;
  local_188[0].data = pfVar2;
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  dVar5 = local_234;
  if (local_220.m_format != (TextureFormat)(local_220.m_size.m_data + 2)) {
    operator_delete((void *)local_220.m_format,local_220._16_8_ + 1);
  }
  local_1f8._4_4_ = this->m_inputPatchSize;
  local_1f8._0_4_ = PRIMITIVETYPE_PATCHES;
  local_1f0 = (long *)CONCAT44(local_1f0._4_4_,INDEXTYPE_LAST);
  local_1e8 = (void *)0x0;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,dVar5,1,(VertexArrayBinding *)local_1b8,
            (PrimitiveList *)local_1f8,(DrawUtilCallback *)0x0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0xbdc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
  }
  if (local_258 != (pointer)0x0) {
    operator_delete(local_258,(long)local_248 - (long)local_258);
  }
  getPixels((Surface *)&local_258,rCtx,local_230.x,local_230.y,local_230.width,local_230.height);
  getPNG((TextureLevel *)local_1b8,
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive,
         &this->m_referenceImagePath);
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1f8,(TextureLevel *)local_1b8);
  local_1c0.order = RGBA;
  local_1c0.type = UNORM_INT8;
  iVar8._M_current = local_248;
  if (local_248 != (float *)0x0) {
    iVar8._M_current = iStack_250._M_current;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_220,&local_1c0,(int)local_258,local_258._4_4_,1,iVar8._M_current);
  bVar3 = tcu::fuzzyCompare((TestLog *)local_1c8,"ImageComparison","Image Comparison",
                            (ConstPixelBufferAccess *)local_1f8,&local_220,0.02,COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar3) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar3,description
            );
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1b8);
  tcu::Surface::~Surface((Surface *)&local_258);
  return STOP;
}

Assistant:

PatchVertexCountCase::IterateResult PatchVertexCountCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	const RandomViewport		viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32				programGL				= m_program->getProgram();
	const glw::Functions&		gl						= renderCtx.getFunctions();

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	log << TestLog::Message << "Note: input patch size is " << m_inputPatchSize << ", output patch size is " << m_outputPatchSize << TestLog::EndMessage;

	{
		vector<float> attributeData;
		attributeData.reserve(m_inputPatchSize);

		for (int i = 0; i < m_inputPatchSize; i++)
		{
			const float f = (float)i / (float)(m_inputPatchSize-1);
			attributeData.push_back(f*f);
		}

		gl.patchParameteri(GL_PATCH_VERTICES, m_inputPatchSize);
		gl.clear(GL_COLOR_BUFFER_BIT);

		const glu::VertexArrayBinding attrBindings[] =
		{
			glu::va::Float("in_v_attr", 1, (int)attributeData.size(), 0, &attributeData[0])
		};

		glu::draw(m_context.getRenderContext(), programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
			glu::pr::Patches(m_inputPatchSize));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	{
		const tcu::Surface			rendered	= getPixels(renderCtx, viewport);
		const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath);
		const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), rendered.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

		m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Image comparison failed");
		return STOP;
	}
}